

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::commitMetering(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  Private_Impl_Still *in_RDI;
  MMAL_PARAMETER_EXPOSUREMETERINGMODE_T meter_mode;
  MMAL_PARAMETER_HEADER_T local_14;
  MMAL_PARAM_EXPOSUREMETERINGMODE_T local_c;
  
  local_14.id = 0x10013;
  local_14.size = 0xc;
  local_c = convertMetering(in_RDI,in_RDI->metering);
  MVar1 = mmal_port_parameter_set(in_RDI->camera->control,&local_14);
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
    std::operator<<(poVar2,": Failed to set metering parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitMetering() {
            MMAL_PARAMETER_EXPOSUREMETERINGMODE_T meter_mode = {{MMAL_PARAMETER_EXP_METERING_MODE, sizeof ( meter_mode ) }, convertMetering ( metering ) };
            if ( mmal_port_parameter_set ( camera->control, &meter_mode.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set metering parameter.\n";
        }